

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O0

void __thiscall FIX::FileLog::onOutgoing(FileLog *this,string *value)

{
  ostream *poVar1;
  int in_ECX;
  UtcTimeStamp local_50;
  string local_38;
  string *local_18;
  string *value_local;
  FileLog *this_local;
  
  local_18 = value;
  value_local = (string *)this;
  UtcTimeStamp::UtcTimeStamp(&local_50);
  UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_38,(UtcTimeStampConvertor *)&local_50,(UtcTimeStamp *)0x9,in_ECX);
  poVar1 = std::operator<<((ostream *)&this->m_messages,(string *)&local_38);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  UtcTimeStamp::~UtcTimeStamp(&local_50);
  return;
}

Assistant:

void onOutgoing( const std::string& value )
  { m_messages << UtcTimeStampConvertor::convert(UtcTimeStamp(), 9) << " : " << value << std::endl; }